

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O2

void Qentem::Digit::FastStringToNumber<unsigned_int,char>(uint *number,char *content,SizeT length)

{
  uint uVar1;
  ulong uVar2;
  
  *number = 0;
  if (length != 0) {
    uVar1 = (int)*content - 0x30;
    *number = uVar1;
    for (uVar2 = 1; length != uVar2; uVar2 = uVar2 + 1) {
      *number = uVar1 * 10;
      uVar1 = (uVar1 * 10 - 0x30) + (int)content[uVar2];
      *number = uVar1;
    }
  }
  return;
}

Assistant:

static void FastStringToNumber(Number_T &number, const Char_T *content, SizeT length) noexcept {
        SizeT offset = 0;
        number       = 0;

        if (offset < length) {
            number += Number_T(content[offset]);
            number -= Number_T{DigitUtils::DigitChar::Zero};
            ++offset;

            while (offset < length) {
                number *= Number_T{10};
                number += Number_T(content[offset]);
                number -= Number_T{DigitUtils::DigitChar::Zero};
                ++offset;
            }
        }
    }